

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O0

void __thiscall cmGccDepfileLexerHelper::addToCurrentPath(cmGccDepfileLexerHelper *this,char *s)

{
  State SVar1;
  bool bVar2;
  reference this_00;
  reference local_28;
  string *dst;
  cmGccStyleDependency *dep;
  char *s_local;
  cmGccDepfileLexerHelper *this_local;
  
  bVar2 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::empty
                    (&this->Content);
  if (!bVar2) {
    this_00 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::back
                        (&this->Content);
    local_28 = (reference)0x0;
    SVar1 = this->HelperState;
    if (SVar1 == Rule) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->rules);
      if (bVar2) {
        return;
      }
      local_28 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(&this_00->rules);
    }
    else if (SVar1 == Dependency) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this_00->paths);
      if (bVar2) {
        return;
      }
      local_28 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(&this_00->paths);
    }
    else if (SVar1 == Failed) {
      return;
    }
    std::__cxx11::string::append((char *)local_28);
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::addToCurrentPath(const char* s)
{
  if (this->Content.empty()) {
    return;
  }
  cmGccStyleDependency* dep = &this->Content.back();
  std::string* dst = nullptr;
  switch (this->HelperState) {
    case State::Rule: {
      if (dep->rules.empty()) {
        return;
      }
      dst = &dep->rules.back();
    } break;
    case State::Dependency: {
      if (dep->paths.empty()) {
        return;
      }
      dst = &dep->paths.back();
    } break;
    case State::Failed:
      return;
  }
  dst->append(s);
}